

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O1

void __thiscall google::protobuf::UnknownFieldSet::DeleteByNumber(UnknownFieldSet *this,int number)

{
  UnknownField *this_00;
  anon_union_8_5_912831f5_for_data_ aVar1;
  uint32 uVar2;
  pointer pUVar3;
  long lVar4;
  ulong uVar5;
  ulong __new_size;
  
  pUVar3 = (this->fields_).
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __new_size = 0;
  if ((this->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_finish != pUVar3) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      this_00 = (UnknownField *)((long)&pUVar3->number_ + lVar4);
      if (*(int *)((long)&pUVar3->number_ + lVar4) == number) {
        UnknownField::Delete(this_00);
      }
      else {
        if (uVar5 != __new_size) {
          uVar2 = this_00->type_;
          aVar1 = this_00->data_;
          pUVar3 = pUVar3 + (int)__new_size;
          pUVar3->number_ = this_00->number_;
          pUVar3->type_ = uVar2;
          pUVar3->data_ = aVar1;
        }
        __new_size = (ulong)((int)__new_size + 1);
      }
      uVar5 = uVar5 + 1;
      pUVar3 = (this->fields_).
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x10;
    } while (uVar5 < (ulong)((long)(this->fields_).
                                   super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar3 >> 4));
    __new_size = (ulong)(int)__new_size;
  }
  std::vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
  resize(&this->fields_,__new_size);
  return;
}

Assistant:

void UnknownFieldSet::DeleteByNumber(int number) {
  int left = 0;  // The number of fields left after deletion.
  for (int i = 0; i < fields_.size(); ++i) {
    UnknownField* field = &(fields_)[i];
    if (field->number() == number) {
      field->Delete();
    } else {
      if (i != left) {
        (fields_)[left] = (fields_)[i];
      }
      ++left;
    }
  }
  fields_.resize(left);
}